

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedTypes.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_30::RemoveUnusedTypes::~RemoveUnusedTypes(RemoveUnusedTypes *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  pcVar2 = (this->super_Pass).name._M_dataplus._M_p;
  paVar1 = &(this->super_Pass).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      // This pass only does anything with GC types.
      return;
    }

    // Consider (rec $A $unused), where anyrefs received from the outside are
    // cast to `$A`. In an open world we cannot remove $unused because that
    // would change the identity of $A. Currently we would incorrectly remove
    // $unused. To fix that, we need to fix our collection of public types to
    // consider $A (and $unused) public in an open world.
    if (!getPassOptions().closedWorld) {
      Fatal() << "RemoveUnusedTypes requires --closed-world";
    }

    // We're not changing the contents of any of the types, so we just round
    // trip them throgh GlobalTypeRewriter, which will put all the private types
    // in a single new rec group and leave out all the unused types.
    GlobalTypeRewriter(*module).update();
  }